

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O1

void FlatZinc::solve(istream *is,ostream *err)

{
  FlatZincSpace *this;
  Array *pAVar1;
  string s;
  ParserState pp;
  char *local_3b8;
  uint local_3b0;
  char local_3a8 [16];
  ParserState local_398;
  
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_3b8,*(undefined8 *)(is + *(long *)(*(long *)is + -0x18) + 0xe8),
             0xffffffff,0,0xffffffff);
  local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.buf = local_3b8;
  local_398.pos = 0;
  local_398.length = local_3b0;
  local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.fg = (FlatZincSpace *)0x0;
  local_398._output.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398._output.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398._output.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header;
  local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.intvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.boolvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.floatvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.setvarTable.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.intvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.boolvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.floatvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.setvararrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.intvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.boolvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.intvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.boolvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.setvals.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset((size_t *)((long)&local_398.setvalarrays.m._M_t._M_impl.super__Rb_tree_header + 0x20),0,
         0x99);
  local_398.err = err;
  yylex_init(&local_398.yyscanner);
  yyset_extra(&local_398,local_398.yyscanner);
  yyparse(&local_398);
  pAVar1 = ParserState::getOutput(&local_398);
  this = FlatZinc::s;
  FlatZinc::s->output = pAVar1;
  FlatZincSpace::setOutput(this);
  if (local_398.yyscanner != (yyscan_t)0x0) {
    yylex_destroy(local_398.yyscanner);
  }
  if (local_398.hadError != true) {
    ParserState::~ParserState(&local_398);
    if (local_3b8 != local_3a8) {
      operator_delete(local_3b8);
    }
    return;
  }
  abort();
}

Assistant:

void solve(std::istream& is, std::ostream& err) {
        std::string s = std::string(std::istreambuf_iterator<char>(is),
                               std::istreambuf_iterator<char>());

        ParserState pp(s, err);
        yylex_init(&pp.yyscanner);
        yyset_extra(&pp, pp.yyscanner);
        // yydebug = 1;
        yyparse(&pp);
        FlatZinc::s->output = pp.getOutput();
        FlatZinc::s->setOutput();

        if (pp.yyscanner)
            yylex_destroy(pp.yyscanner);
        if (pp.hadError) abort();
    }